

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void end_examples<dense_parameters>(lda *l,dense_parameters *weights)

{
  bool bVar1;
  float **ppfVar2;
  float *pfVar3;
  long in_RDI;
  float fVar4;
  double dVar5;
  size_t i;
  weight *wp;
  float decay;
  float decay_component;
  iterator iter;
  dense_parameters *in_stack_ffffffffffffffa0;
  ulong local_58;
  dense_iterator<float> local_40;
  dense_iterator<float> local_28;
  long local_8;
  
  local_8 = in_RDI;
  dense_parameters::begin(in_stack_ffffffffffffffa0);
  while( true ) {
    dense_parameters::end(in_stack_ffffffffffffffa0);
    bVar1 = dense_iterator<float>::operator!=(&local_28,&local_40);
    if (!bVar1) break;
    fVar4 = v_array<float>::last((v_array<float> *)(local_8 + 0x48));
    ppfVar2 = v_array<float>::end((v_array<float> *)(local_8 + 0x48));
    in_stack_ffffffffffffffa0 = (dense_parameters *)*ppfVar2;
    dVar5 = *(double *)(local_8 + 0x180);
    pfVar3 = dense_iterator<float>::operator*(&local_28);
    dVar5 = std::exp((double)(ulong)(uint)(fVar4 - *(float *)((long)&in_stack_ffffffffffffffa0->
                                                                     _begin +
                                                             (long)(int)((-1.0 - dVar5) +
                                                                        (double)pfVar3[*(uint *)(*(
                                                  long *)(local_8 + 0x188) + 0x3478)]) * 4)));
    dVar5 = std::fmin(5.26354424712089e-315,dVar5);
    pfVar3 = dense_iterator<float>::operator*(&local_28);
    for (local_58 = 0; local_58 < *(uint *)(*(long *)(local_8 + 0x188) + 0x3478);
        local_58 = local_58 + 1) {
      pfVar3[local_58] = SUB84(dVar5,0) * pfVar3[local_58];
    }
    dense_iterator<float>::operator++(&local_28);
  }
  return;
}

Assistant:

void end_examples(lda &l, T &weights)
{
  for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
  {
    float decay_component =
        l.decay_levels.last() - l.decay_levels.end()[(int)(-1 - l.example_t + (&(*iter))[l.all->lda])];
    float decay = fmin(1.f, correctedExp(decay_component));

    weight *wp = &(*iter);
    for (size_t i = 0; i < l.all->lda; ++i) wp[i] *= decay;
  }
}